

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O3

string * __thiscall
duckdb::ExtensionHelper::ExtensionDirectory_abi_cxx11_
          (string *__return_storage_ptr__,ExtensionHelper *this,DatabaseInstance *db,FileSystem *fs)

{
  pointer pcVar1;
  char cVar2;
  bool bVar3;
  long *plVar4;
  long *plVar5;
  pointer __rhs;
  string sep;
  string extension_directory_prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  GetExtensionDirectoryPath_abi_cxx11_(__return_storage_ptr__,this,db,fs);
  cVar2 = (**(code **)((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->config).extension_parameters + 0x18))
                    (db,__return_storage_ptr__,0);
  if (cVar2 == '\0') {
    (*(code *)(((string *)
               ((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                         internal.
                         super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->config).options + 0x20))->_M_dataplus)._M_p)
              (&local_108,db,__return_storage_ptr__);
    StringUtil::Split(&local_a8,__return_storage_ptr__,&local_108);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_local_buf[0] = '\0';
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_108._M_dataplus._M_p,
               local_108._M_dataplus._M_p + local_108._M_string_length);
    bVar3 = StringUtil::StartsWith(&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (bVar3) {
      ::std::__cxx11::string::_M_assign((string *)&local_c8);
    }
    if (local_a8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_a8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __rhs = local_a8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::operator+(&local_90,&local_c8,__rhs);
        plVar4 = (long *)::std::__cxx11::string::_M_append
                                   ((char *)&local_90,(ulong)local_108._M_dataplus._M_p);
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_d8 = *plVar5;
          lStack_d0 = plVar4[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar5;
          local_e8 = (long *)*plVar4;
        }
        local_e0 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        ::std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_e8);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        cVar2 = (**(code **)((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                      __weak_this_.internal.
                                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->config).extension_parameters + 0x18))(db,&local_c8,0)
        ;
        if (cVar2 == '\0') {
          (**(code **)((long)&(((db->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                                __weak_this_.internal.
                                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->config).extension_parameters + 0x20))(db,&local_c8,0);
        }
        __rhs = __rhs + 1;
      } while (__rhs != local_a8.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string ExtensionHelper::ExtensionDirectory(DatabaseInstance &db, FileSystem &fs) {
#ifdef WASM_LOADABLE_EXTENSIONS
	throw PermissionException("ExtensionDirectory functionality is not supported in duckdb-wasm");
#endif
	string extension_directory = GetExtensionDirectoryPath(db, fs);
	{
		if (!fs.DirectoryExists(extension_directory)) {
			auto sep = fs.PathSeparator(extension_directory);
			auto splits = StringUtil::Split(extension_directory, sep);
			D_ASSERT(!splits.empty());
			string extension_directory_prefix;
			if (StringUtil::StartsWith(extension_directory, sep)) {
				extension_directory_prefix = sep; // this is swallowed by Split otherwise
			}
			for (auto &split : splits) {
				extension_directory_prefix = extension_directory_prefix + split + sep;
				if (!fs.DirectoryExists(extension_directory_prefix)) {
					fs.CreateDirectory(extension_directory_prefix);
				}
			}
		}
	}
	D_ASSERT(fs.DirectoryExists(extension_directory));

	return extension_directory;
}